

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsKeyPressed(int user_key_index,bool repeat)

{
  float fVar1;
  float repeat_delay;
  bool bVar2;
  int iVar3;
  
  if (user_key_index < 0) {
    return false;
  }
  fVar1 = (GImGui->IO).KeysDownDuration[(uint)user_key_index];
  bVar2 = fVar1 == 0.0;
  if (repeat && !bVar2) {
    repeat_delay = (GImGui->IO).KeyRepeatDelay;
    if (fVar1 <= repeat_delay) {
      return false;
    }
    iVar3 = GetKeyPressedAmount(user_key_index,repeat_delay,(GImGui->IO).KeyRepeatRate);
    bVar2 = 0 < iVar3;
  }
  return bVar2;
}

Assistant:

bool ImGui::IsKeyPressed(int user_key_index, bool repeat)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0) return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[user_key_index];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(user_key_index, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}